

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void lzx_br_fixup(lzx_stream *strm,lzx_br *br)

{
  wchar_t n;
  lzx_br *br_local;
  lzx_stream *strm_local;
  
  if (((br->have_odd != '\0') && (0xf < 0x40 - br->cache_avail)) && (0 < strm->avail_in)) {
    br->cache_buffer =
         br->cache_buffer << 0x10 | (long)(int)((uint)*strm->next_in << 8) | (ulong)br->odd;
    strm->next_in = strm->next_in + 1;
    strm->avail_in = strm->avail_in + -1;
    br->cache_avail = br->cache_avail + L'\x10';
    br->have_odd = '\0';
  }
  return;
}

Assistant:

static void
lzx_br_fixup(struct lzx_stream *strm, struct lzx_br *br)
{
	int n = CACHE_BITS - br->cache_avail;

	if (br->have_odd && n >= 16 && strm->avail_in > 0) {
		br->cache_buffer =
		   (br->cache_buffer << 16) |
		   ((uint16_t)(*strm->next_in)) << 8 | br->odd;
		strm->next_in++;
		strm->avail_in--;
		br->cache_avail += 16;
		br->have_odd = 0;
	}
}